

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mioUtils.c
# Opt level: O3

void Mio_LibraryHashGates(Mio_Library_t *pLib)

{
  Mio_Gate_t *pMVar1;
  st__table *psVar2;
  
  pMVar1 = Mio_LibraryReadGates(pLib);
  while( true ) {
    if (pMVar1 == (Mio_Gate_t *)0x0) {
      if (pLib->tName2Gate != (st__table *)0x0) {
        st__free_table(pLib->tName2Gate);
      }
      psVar2 = st__init_table(strcmp,st__strhash);
      pLib->tName2Gate = psVar2;
      for (pMVar1 = Mio_LibraryReadGates(pLib); pMVar1 != (Mio_Gate_t *)0x0;
          pMVar1 = Mio_GateReadNext(pMVar1)) {
        st__insert(pLib->tName2Gate,pMVar1->pName,(char *)pMVar1);
      }
      return;
    }
    if (pMVar1->pTwin != (Mio_Gate_t *)0x0) break;
    pMVar1 = Mio_GateReadNext(pMVar1);
  }
  puts("Gates with multiple outputs are not supported.");
  return;
}

Assistant:

void Mio_LibraryHashGates( Mio_Library_t * pLib )
{
    Mio_Gate_t * pGate;    
    Mio_LibraryForEachGate( pLib, pGate )
        if ( pGate->pTwin )
        {
            printf( "Gates with multiple outputs are not supported.\n" );
            return;
        }
    if ( pLib->tName2Gate )
        st__free_table( pLib->tName2Gate );
    pLib->tName2Gate = st__init_table(strcmp, st__strhash);
    Mio_LibraryForEachGate( pLib, pGate )
        st__insert( pLib->tName2Gate, pGate->pName, (char *)pGate );
}